

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O2

DdNode * Llb_ManConstructGroupBdd(Llb_Man_t *p,Llb_Grp_t *pGroup)

{
  DdManager *pDVar1;
  int iVar2;
  DdNode *pDVar3;
  void *pvVar4;
  DdNode *pDVar5;
  int iVar6;
  DdNode *pDVar7;
  
  pDVar3 = Cudd_ReadOne(p->dd);
  (p->pAig->pConst1->field_5).pData = pDVar3;
  for (iVar6 = 0; iVar6 < pGroup->vIns->nSize; iVar6 = iVar6 + 1) {
    pvVar4 = Vec_PtrEntry(pGroup->vIns,iVar6);
    pDVar1 = p->dd;
    iVar2 = Vec_IntEntry(p->vObj2Var,*(int *)((long)pvVar4 + 0x24));
    pDVar3 = Cudd_bddIthVar(pDVar1,iVar2);
    *(DdNode **)((long)pvVar4 + 0x28) = pDVar3;
  }
  for (iVar6 = 0; iVar6 < pGroup->vNodes->nSize; iVar6 = iVar6 + 1) {
    pvVar4 = Vec_PtrEntry(pGroup->vNodes,iVar6);
    pDVar3 = Cudd_bddAnd(p->dd,(DdNode *)
                               ((ulong)((uint)*(ulong *)((long)pvVar4 + 8) & 1) ^
                               *(ulong *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x28
                                         )),
                         (DdNode *)
                         ((ulong)((uint)*(ulong *)((long)pvVar4 + 0x10) & 1) ^
                         *(ulong *)((*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe) + 0x28)))
    ;
    *(DdNode **)((long)pvVar4 + 0x28) = pDVar3;
    if (pDVar3 == (DdNode *)0x0) {
      for (iVar2 = 0; iVar6 != iVar2; iVar2 = iVar2 + 1) {
        pvVar4 = Vec_PtrEntry(pGroup->vNodes,iVar2);
        if (*(DdNode **)((long)pvVar4 + 0x28) != (DdNode *)0x0) {
          Cudd_RecursiveDeref(p->dd,*(DdNode **)((long)pvVar4 + 0x28));
        }
      }
      return (DdNode *)0x0;
    }
    Cudd_Ref(pDVar3);
  }
  pDVar3 = Cudd_ReadOne(p->dd);
  Cudd_Ref(pDVar3);
  iVar6 = 0;
  while( true ) {
    if (pGroup->vOuts->nSize <= iVar6) {
      for (iVar6 = 0; iVar6 < pGroup->vNodes->nSize; iVar6 = iVar6 + 1) {
        pvVar4 = Vec_PtrEntry(pGroup->vNodes,iVar6);
        Cudd_RecursiveDeref(p->dd,*(DdNode **)((long)pvVar4 + 0x28));
      }
      Cudd_Deref(pDVar3);
      return pDVar3;
    }
    pvVar4 = Vec_PtrEntry(pGroup->vOuts,iVar6);
    if ((*(uint *)((long)pvVar4 + 0x18) & 7) == 3) {
      pDVar7 = (DdNode *)
               ((ulong)((uint)*(ulong *)((long)pvVar4 + 8) & 1) ^
               *(ulong *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x28));
    }
    else {
      pDVar7 = *(DdNode **)((long)pvVar4 + 0x28);
    }
    pDVar1 = p->dd;
    iVar2 = Vec_IntEntry(p->vObj2Var,*(int *)((long)pvVar4 + 0x24));
    pDVar5 = Cudd_bddIthVar(pDVar1,iVar2);
    pDVar7 = Cudd_bddXor(p->dd,pDVar7,pDVar5);
    Cudd_Ref(pDVar7);
    pDVar5 = Cudd_bddAnd(p->dd,pDVar3,(DdNode *)((ulong)pDVar7 ^ 1));
    if (pDVar5 == (DdNode *)0x0) break;
    Cudd_Ref(pDVar5);
    Cudd_RecursiveDeref(p->dd,pDVar3);
    Cudd_RecursiveDeref(p->dd,pDVar7);
    iVar6 = iVar6 + 1;
    pDVar3 = pDVar5;
  }
  Cudd_RecursiveDeref(p->dd,pDVar3);
  Cudd_RecursiveDeref(p->dd,pDVar7);
  for (iVar2 = 0; iVar6 != iVar2; iVar2 = iVar2 + 1) {
    pvVar4 = Vec_PtrEntry(pGroup->vNodes,iVar2);
    if (*(DdNode **)((long)pvVar4 + 0x28) != (DdNode *)0x0) {
      Cudd_RecursiveDeref(p->dd,*(DdNode **)((long)pvVar4 + 0x28));
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode * Llb_ManConstructGroupBdd( Llb_Man_t * p, Llb_Grp_t * pGroup )
{
    Aig_Obj_t * pObj;
    DdNode * bBdd0, * bBdd1, * bRes, * bXor, * bTemp;
    int i, k;
    Aig_ManConst1(p->pAig)->pData = Cudd_ReadOne( p->dd );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pObj, i )
        pObj->pData = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj)) );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vNodes, pObj, i )
    {
        bBdd0 = Cudd_NotCond( Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
//        pObj->pData = Extra_bddAndTime( p->dd, bBdd0, bBdd1, p->pPars->TimeTarget );  
        pObj->pData = Cudd_bddAnd( p->dd, bBdd0, bBdd1 );  
        if ( pObj->pData == NULL )
        {
            Vec_PtrForEachEntryStop( Aig_Obj_t *, pGroup->vNodes, pObj, k, i )
                if ( pObj->pData )
                    Cudd_RecursiveDeref( p->dd, (DdNode *)pObj->pData );
            return NULL;
        }
        Cudd_Ref( (DdNode *)pObj->pData );
    }
    bRes = Cudd_ReadOne( p->dd );   Cudd_Ref( bRes );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pObj, i )
    {
        if ( Aig_ObjIsCo(pObj) )
            bBdd0 = Cudd_NotCond( Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        else
            bBdd0 = (DdNode *)pObj->pData;
        bBdd1 = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj)) );
        bXor  = Cudd_bddXor( p->dd, bBdd0, bBdd1 );                  Cudd_Ref( bXor );
//        bRes  = Extra_bddAndTime( p->dd, bTemp = bRes, Cudd_Not(bXor), p->pPars->TimeTarget );  
        bRes  = Cudd_bddAnd( p->dd, bTemp = bRes, Cudd_Not(bXor) );  
        if ( bRes == NULL )
        {
            Cudd_RecursiveDeref( p->dd, bTemp );
            Cudd_RecursiveDeref( p->dd, bXor );
            Vec_PtrForEachEntryStop( Aig_Obj_t *, pGroup->vNodes, pObj, k, i )
                if ( pObj->pData )
                    Cudd_RecursiveDeref( p->dd, (DdNode *)pObj->pData );
            return NULL;
        }        
        Cudd_Ref( bRes );
        Cudd_RecursiveDeref( p->dd, bTemp );
        Cudd_RecursiveDeref( p->dd, bXor );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vNodes, pObj, i )
        Cudd_RecursiveDeref( p->dd, (DdNode *)pObj->pData );
    Cudd_Deref( bRes );
    return bRes;
}